

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O2

void __thiscall
tlx::
SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
::resize(SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
         *this,size_type new_size)

{
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *__first;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *__result;
  ulong uVar1;
  value_type *tmp;
  
  __first = this->array_;
  __result = create_array(new_size);
  this->array_ = __result;
  if (__first != (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)0x0) {
    uVar1 = this->size_;
    if (new_size <= this->size_) {
      uVar1 = new_size;
    }
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*,tlx::CountingPtr<foxxll::file,tlx::CountingPtrDefaultDeleter>*>
              (__first,__first + uVar1,__result);
    destroy_array(__first,this->size_);
  }
  this->size_ = new_size;
  return;
}

Assistant:

void resize(size_type new_size) {
        if (array_) {
            value_type* tmp = array_;
            array_ = create_array(new_size);
            std::move(tmp, tmp + std::min(size_, new_size), array_);
            destroy_array(tmp, size_);
            size_ = new_size;
        }
        else {
            array_ = create_array(new_size);
            size_ = new_size;
        }
    }